

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Internal_WriteObject(ON_BinaryArchive *this,ON_Object *model_object)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte local_3e;
  bool local_3d;
  undefined1 auStack_3c [6];
  bool bChunkDataOk;
  bool bChunkIdOk;
  ON_UUID object_class_id;
  bool rc;
  ON_ClassId *pID;
  ON_Object *model_object_local;
  ON_BinaryArchive *this_local;
  
  iVar2 = (**model_object->_vptr_ON_Object)();
  register0x00000000 = (ON_ClassId *)CONCAT44(extraout_var,iVar2);
  if (register0x00000000 == (ON_ClassId *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x127d,"","archive_object->ClassId() is nullptr.");
    this_local._7_1_ = false;
  }
  else {
    bVar1 = BeginWrite3dmChunk(this,0x27ffa,0);
    if (bVar1) {
      object_class_id.Data4[3] = '\0';
      bVar1 = BeginWrite3dmChunk(this,0x2fffb,0);
      if (bVar1) {
        _auStack_3c = ON_ClassId::Uuid(stack0xffffffffffffffd8);
        local_3d = WriteUuid(this,(ON_UUID *)auStack_3c);
        bVar1 = EndWrite3dmChunk(this);
        if (!bVar1) {
          local_3d = false;
        }
        if ((local_3d != false) && (bVar1 = BeginWrite3dmChunk(this,0x2fffc,0), bVar1)) {
          iVar2 = (*model_object->_vptr_ON_Object[10])(model_object,this);
          local_3e = -(char)iVar2 & 1;
          if (local_3e == 0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x1297,"","archive_object->Write() failed.");
          }
          bVar1 = EndWrite3dmChunk(this);
          if (!bVar1) {
            local_3e = 0;
          }
          if (((local_3e != 0) &&
              (((bVar1 = ObjectHasUserDataToWrite(this,model_object), !bVar1 ||
                (bVar1 = WriteObjectUserData(this,model_object), bVar1)) &&
               (bVar1 = BeginWrite3dmChunk(this,0x80027fff,0), bVar1)))) &&
             (bVar1 = EndWrite3dmChunk(this), bVar1)) {
            object_class_id.Data4[3] = '\x01';
          }
        }
      }
      bVar1 = EndWrite3dmChunk(this);
      if (!bVar1) {
        object_class_id.Data4[3] = '\0';
      }
      this_local._7_1_ = (bool)(object_class_id.Data4[3] & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Internal_WriteObject(
  const ON_Object& model_object
)
{
  const ON_ClassId* pID = model_object.ClassId();
  if ( nullptr == pID )
  {
    ON_ERROR("archive_object->ClassId() is nullptr.");
    return false;
  }
    
  if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS, 0))
    return false;

  bool rc = false;
  for (;;)
  {
    // TCODE_OPENNURBS_CLASS_UUID chunk contains class's UUID 
    if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS_UUID, 0))
      break;
    const ON_UUID object_class_id = pID->Uuid();
    bool bChunkIdOk = WriteUuid(object_class_id);
    if (false == EndWrite3dmChunk()) // end of TCODE_OPENNURBS_CLASS_UUID chunk
      bChunkIdOk = false;
    if (false == bChunkIdOk)
      break;

    // TCODE_OPENNURBS_CLASS_DATA chunk contains definition of class
    if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS_DATA, 0))
      break;
    bool bChunkDataOk = model_object.Write(*this) ? true : false;
    if (false == bChunkDataOk)
    {
      ON_ERROR("archive_object->Write() failed.");
    }
    if (false == EndWrite3dmChunk()) // end of TCODE_OPENNURBS_CLASS_DATA chunk
      bChunkDataOk = false;
    if (false == bChunkDataOk)
      break;

    if ( ObjectHasUserDataToWrite(&model_object) )
    {
      // write user data.  Each piece of user data is in a 
      // TCODE_OPENNURBS_CLASS_USERDATA chunk.
      if (false == WriteObjectUserData(model_object))
        break;
    }

    // TCODE_OPENNURBS_CLASS_END chunk marks end of class record
    if (false == BeginWrite3dmChunk(TCODE_OPENNURBS_CLASS_END, 0))
      break;
    if (false == EndWrite3dmChunk())
      break;

    rc = true;
    break;
  }

  if (false == EndWrite3dmChunk()) // end of TCODE_OPENNURBS_CLASS chunk
    rc = false;

  return rc;
}